

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

bool fp::API::wallFront(void)

{
  bool bVar1;
  ostream *this;
  string local_28 [8];
  string response;
  
  this = std::operator<<((ostream *)&std::cout,"wallFront");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_28);
  std::operator>>((istream *)&std::cin,local_28);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_28,"true");
  std::__cxx11::string::~string(local_28);
  return bVar1;
}

Assistant:

bool fp::API::wallFront() {
    std::cout << "wallFront" << std::endl;
    std::string response;
    std::cin >> response;
    return response == "true";
}